

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O1

void * unpack_new(t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  t_object *owner;
  _gobj *p_Var2;
  _outlet *p_Var3;
  t_symbol *s_00;
  long lVar4;
  undefined4 uVar5;
  t_atom defarg [2];
  t_atom local_58;
  undefined4 local_48;
  undefined4 local_40;
  
  owner = (t_object *)pd_new(unpack_class);
  if (argc == 0) {
    local_58.a_type = A_FLOAT;
    local_58.a_w.w_float = 0.0;
    local_48 = 1;
    local_40 = 0;
    argc = 2;
    argv = &local_58;
  }
  owner[1].te_g.g_pd = (t_pd)(long)argc;
  p_Var2 = (_gobj *)getbytes((long)argc << 4);
  owner[1].te_g.g_next = p_Var2;
  if (0 < argc) {
    lVar4 = 0;
    do {
      uVar5 = 1;
      if (*(int *)((long)&argv->a_type + lVar4) == 2) {
        cVar1 = *(char *)**(undefined8 **)((long)&argv->a_w + lVar4);
        if (cVar1 == 'f') goto LAB_0017ed18;
        if (cVar1 == 's') {
          uVar5 = 2;
          s_00 = &s_symbol;
        }
        else {
          if (cVar1 != 'p') {
            pd_error(owner,"unpack: %s: bad type");
            goto LAB_0017ed18;
          }
          uVar5 = 3;
          s_00 = &s_pointer;
        }
      }
      else {
LAB_0017ed18:
        s_00 = &s_float;
      }
      *(undefined4 *)((long)&p_Var2->g_pd + lVar4) = uVar5;
      p_Var3 = outlet_new(owner,s_00);
      *(_outlet **)((long)&p_Var2->g_next + lVar4) = p_Var3;
      lVar4 = lVar4 + 0x10;
      argc = argc + -1;
    } while (argc != 0);
  }
  return owner;
}

Assistant:

static void *unpack_new(t_symbol *s, int argc, t_atom *argv)
{
    t_unpack *x = (t_unpack *)pd_new(unpack_class);
    t_atom defarg[2], *ap;
    t_unpackout *u;
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 0);
        SETFLOAT(&defarg[1], 0);
    }
    x->x_n = argc;
    x->x_vec = (t_unpackout *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0, ap = argv, u = x->x_vec; i < argc; u++, ap++, i++)
    {
        t_atomtype type = ap->a_type;
        if (type == A_SYMBOL)
        {
            char c = *ap->a_w.w_symbol->s_name;
            if (c == 's')
            {
                u->u_type = A_SYMBOL;
                u->u_outlet = outlet_new(&x->x_obj, &s_symbol);
            }
            else if (c == 'p')
            {
                u->u_type =  A_POINTER;
                u->u_outlet = outlet_new(&x->x_obj, &s_pointer);
            }
            else
            {
                if (c != 'f') pd_error(x, "unpack: %s: bad type",
                    ap->a_w.w_symbol->s_name);
                u->u_type = A_FLOAT;
                u->u_outlet = outlet_new(&x->x_obj, &s_float);
            }
        }
        else
        {
            u->u_type =  A_FLOAT;
            u->u_outlet = outlet_new(&x->x_obj, &s_float);
        }
    }
    return (x);
}